

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int allocateBtreePage(BtShared *pBt,MemPage **ppPage,Pgno *pPgno,Pgno nearby,u8 eMode)

{
  u8 uVar1;
  MemPage *pMVar2;
  u8 *puVar3;
  Bitvec *p;
  bool bVar4;
  MemPage *pMVar5;
  u32 x;
  Pgno PVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint *puVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  u32 x_5;
  MemPage *pMVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  MemPage *pMVar18;
  uint uVar19;
  bool bVar20;
  MemPage *pTrunk;
  u8 eType;
  MemPage *local_60;
  uint local_54;
  MemPage *local_50;
  uint *local_48;
  Pgno local_3c;
  ulong local_38;
  
  local_60 = (MemPage *)0x0;
  pMVar2 = pBt->pPage1;
  uVar16 = pBt->nPage;
  uVar11 = *(uint *)(pMVar2->aData + 0x24);
  uVar15 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  local_38 = (ulong)uVar15;
  if (uVar15 < uVar16) {
    if (uVar11 == 0) {
      uVar1 = pBt->bDoTruncate;
      iVar7 = sqlite3PagerWrite(pMVar2->pDbPage);
      if (iVar7 == 0) {
        uVar11 = pBt->nPage;
        uVar16 = uVar11 + 1;
        pBt->nPage = uVar16;
        uVar15 = (uint)sqlite3PendingByte / pBt->pageSize;
        if (uVar11 == uVar15) {
          uVar16 = uVar11 + 2;
          pBt->nPage = uVar16;
        }
        uVar11 = (uint)(uVar1 == '\0');
        if (pBt->autoVacuum != '\0') {
          PVar6 = 0;
          if (1 < uVar16) {
            iVar7 = (uVar16 - 2) - (uVar16 - 2) % (pBt->usableSize / 5 + 1);
            PVar6 = iVar7 + (uint)(iVar7 + 1U == uVar15) + 2;
          }
          if (PVar6 == uVar16) {
            local_50 = (MemPage *)0x0;
            iVar7 = btreeGetUnusedPage(pBt,uVar16,&local_50,uVar11);
            pMVar2 = local_50;
            if (iVar7 != 0) {
              return iVar7;
            }
            iVar7 = sqlite3PagerWrite(local_50->pDbPage);
            sqlite3PagerUnrefNotNull(pMVar2->pDbPage);
            if (iVar7 != 0) {
              return iVar7;
            }
            uVar15 = pBt->nPage;
            uVar16 = uVar15 + 1;
            pBt->nPage = uVar16;
            if (uVar15 == (uint)sqlite3PendingByte / pBt->pageSize) {
              uVar16 = uVar15 + 2;
              pBt->nPage = uVar16;
            }
          }
        }
        *(uint *)(pBt->pPage1->aData + 0x1c) =
             uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
        PVar6 = pBt->nPage;
        *pPgno = PVar6;
        iVar7 = btreeGetUnusedPage(pBt,PVar6,ppPage,uVar11);
        if (iVar7 == 0) {
          iVar7 = sqlite3PagerWrite((*ppPage)->pDbPage);
          if (iVar7 == 0) {
            iVar7 = 0;
          }
          else {
            if (*ppPage != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
            }
            *ppPage = (MemPage *)0x0;
          }
        }
      }
    }
    else {
      local_48 = pPgno;
      local_3c = nearby;
      if (eMode == '\x02') {
        bVar20 = true;
      }
      else if ((eMode == '\x01') && (nearby <= uVar16)) {
        iVar7 = ptrmapGet(pBt,nearby,(u8 *)&local_50,(Pgno *)0x0);
        bVar20 = (char)local_50 == '\x02';
        if (iVar7 != 0) {
          return iVar7;
        }
      }
      else {
        bVar20 = false;
      }
      iVar7 = sqlite3PagerWrite(pMVar2->pDbPage);
      if (iVar7 == 0) {
        uVar11 = (int)local_38 - 1;
        *(uint *)(pMVar2->aData + 0x24) =
             uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 * 0x1000000
        ;
        local_54 = 0;
        pMVar14 = (MemPage *)0x0;
        do {
          if (pMVar14 == (MemPage *)0x0) {
            puVar10 = (uint *)(pMVar2->aData + 0x20);
          }
          else {
            puVar10 = (uint *)pMVar14->aData;
          }
          uVar11 = *puVar10;
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          if ((uVar16 < uVar11) || ((uint)local_38 < local_54)) {
            iVar7 = 0xb;
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfbed,
                        "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
LAB_00129e5c:
            local_60 = (MemPage *)0x0;
            goto LAB_00129f4e;
          }
          iVar7 = btreeGetUnusedPage(pBt,uVar11,&local_60,0);
          puVar10 = local_48;
          pMVar18 = local_60;
          if (iVar7 != 0) goto LAB_00129e5c;
          puVar3 = local_60->aData;
          uVar15 = *(uint *)(puVar3 + 4);
          if ((bVar20) || (uVar15 != 0)) {
            uVar19 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                     uVar15 << 0x18;
            if ((pBt->usableSize >> 2) - 2 < uVar19) {
              iVar7 = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc0a,
                          "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
              goto LAB_00129f45;
            }
            if (bVar20) {
              if ((uVar11 == local_3c) || (eMode == '\x02' && uVar11 < local_3c)) {
                *local_48 = uVar11;
                *ppPage = local_60;
                iVar7 = sqlite3PagerWrite(local_60->pDbPage);
                if (iVar7 != 0) goto LAB_00129f45;
                if (uVar15 == 0) {
                  if (pMVar14 == (MemPage *)0x0) {
                    *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pMVar18->aData;
                  }
                  else {
                    iVar7 = sqlite3PagerWrite(pMVar14->pDbPage);
                    if (iVar7 != 0) goto LAB_00129f45;
                    *(undefined4 *)pMVar14->aData = *(undefined4 *)pMVar18->aData;
                  }
                }
                else {
                  uVar11 = *(uint *)(pMVar18->aData + 8);
                  uVar15 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                           uVar11 << 0x18;
                  if (uVar16 < uVar15) {
                    iVar7 = 0xb;
                    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc2c,
                                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
                    goto LAB_00129f45;
                  }
                  iVar7 = btreeGetUnusedPage(pBt,uVar15,&local_50,0);
                  pMVar5 = local_50;
                  if (iVar7 != 0) goto LAB_00129f45;
                  iVar7 = sqlite3PagerWrite(local_50->pDbPage);
                  if (iVar7 != 0) {
                    sqlite3PagerUnrefNotNull(pMVar5->pDbPage);
                    goto LAB_00129f45;
                  }
                  *(undefined4 *)pMVar5->aData = *(undefined4 *)pMVar18->aData;
                  uVar15 = uVar19 - 1;
                  *(uint *)(pMVar5->aData + 4) =
                       uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                       uVar15 * 0x1000000;
                  memcpy(pMVar5->aData + 8,pMVar18->aData + 0xc,(ulong)(uVar19 * 4 - 4));
                  sqlite3PagerUnrefNotNull(pMVar5->pDbPage);
                  if (pMVar14 == (MemPage *)0x0) {
                    puVar10 = (uint *)(pMVar2->aData + 0x20);
                  }
                  else {
                    iVar7 = sqlite3PagerWrite(pMVar14->pDbPage);
                    if (iVar7 != 0) goto LAB_00129f45;
                    puVar10 = (uint *)pMVar14->aData;
                  }
                  *puVar10 = uVar11;
                }
                local_60 = (MemPage *)0x0;
                pMVar18 = (MemPage *)0x0;
                bVar4 = false;
                iVar7 = 0;
                goto LAB_00129dc7;
              }
            }
            if (uVar15 != 0) {
              uVar11 = 0;
              if (local_3c != 0) {
                uVar11 = 0;
                if (eMode == '\x02') {
                  uVar12 = 8;
                  uVar13 = 0;
                  do {
                    uVar15 = *(uint *)(puVar3 + (uVar12 & 0xffffffff));
                    if ((uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                        uVar15 << 0x18) <= local_3c) {
                      uVar11 = (uint)uVar13;
                      break;
                    }
                    uVar13 = uVar13 + 1;
                    uVar12 = uVar12 + 4;
                  } while (uVar19 + (uVar19 == 0) != uVar13);
                }
                else if (1 < uVar19) {
                  uVar11 = *(uint *)(puVar3 + 8);
                  iVar9 = (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                          uVar11 << 0x18) - local_3c;
                  iVar7 = -iVar9;
                  if (-1 < iVar9) {
                    iVar7 = iVar9;
                  }
                  uVar11 = 0;
                  uVar12 = 1;
                  uVar15 = 0xc;
                  do {
                    uVar8 = *(uint *)(puVar3 + uVar15);
                    iVar17 = (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                             uVar8 << 0x18) - local_3c;
                    iVar9 = -iVar17;
                    if (-1 < iVar17) {
                      iVar9 = iVar17;
                    }
                    if (iVar9 < iVar7) {
                      uVar11 = (uint)uVar12;
                      iVar7 = iVar9;
                    }
                    uVar12 = uVar12 + 1;
                    uVar15 = uVar15 + 4;
                  } while (uVar19 != uVar12);
                }
              }
              uVar15 = uVar11 * 4 + 8;
              uVar8 = *(uint *)(puVar3 + uVar15);
              uVar8 = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                      uVar8 << 0x18;
              if (uVar16 < uVar8) {
                iVar7 = 0xb;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfc6d,
                            "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
                goto LAB_00129df0;
              }
              if (((uVar8 == local_3c) || (eMode == '\x02' && uVar8 < local_3c)) || (!bVar20)) {
                *local_48 = uVar8;
                iVar7 = sqlite3PagerWrite(local_60->pDbPage);
                if (iVar7 == 0) {
                  uVar8 = uVar19 - 1;
                  if (uVar11 < uVar8) {
                    *(undefined4 *)(puVar3 + uVar15) = *(undefined4 *)(puVar3 + (uVar19 * 4 + 4));
                  }
                  *(uint *)(puVar3 + 4) =
                       uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar8 & 0xff00) << 8 |
                       uVar8 * 0x1000000;
                  uVar11 = *puVar10;
                  p = pBt->pHasContent;
                  if (p == (Bitvec *)0x0) {
                    uVar15 = 1;
                  }
                  else {
                    uVar15 = 0;
                    if (uVar11 <= p->iSize) {
                      iVar7 = sqlite3BitvecTestNotNull(p,uVar11);
                      uVar15 = (uint)(iVar7 == 0);
                    }
                  }
                  iVar7 = btreeGetUnusedPage(pBt,uVar11,ppPage,uVar15);
                  if ((iVar7 == 0) &&
                     (iVar9 = sqlite3PagerWrite((*ppPage)->pDbPage), iVar7 = 0, iVar9 != 0)) {
                    if (*ppPage != (MemPage *)0x0) {
                      sqlite3PagerUnrefNotNull((*ppPage)->pDbPage);
                    }
                    *ppPage = (MemPage *)0x0;
                    iVar7 = iVar9;
                  }
                  bVar4 = false;
                  goto LAB_00129dc7;
                }
                goto LAB_00129f45;
              }
              bVar20 = true;
            }
            iVar7 = 0;
            bVar4 = bVar20;
          }
          else {
            iVar7 = sqlite3PagerWrite(local_60->pDbPage);
            if (iVar7 != 0) goto LAB_00129f45;
            *local_48 = uVar11;
            *(undefined4 *)(pMVar2->aData + 0x20) = *(undefined4 *)pMVar18->aData;
            *ppPage = pMVar18;
            local_60 = (MemPage *)0x0;
            pMVar18 = (MemPage *)0x0;
            iVar7 = 0;
            bVar4 = false;
          }
LAB_00129dc7:
          if (pMVar14 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar14->pDbPage);
          }
          local_54 = local_54 + 1;
          bVar20 = true;
          pMVar14 = pMVar18;
        } while (bVar4);
        pMVar14 = (MemPage *)0x0;
LAB_00129df0:
        if (pMVar18 != (MemPage *)0x0) {
LAB_00129f45:
          sqlite3PagerUnrefNotNull(pMVar18->pDbPage);
        }
LAB_00129f4e:
        if (pMVar14 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar14->pDbPage);
        }
      }
    }
  }
  else {
    iVar7 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0xfbb5,
                "ada05cfa86ad7f5645450ac7a2a21c9aa6e57d2c");
  }
  return iVar7;
}

Assistant:

static int allocateBtreePage(
  BtShared *pBt,         /* The btree */
  MemPage **ppPage,      /* Store pointer to the allocated page here */
  Pgno *pPgno,           /* Store the page number here */
  Pgno nearby,           /* Search for a page near this one */
  u8 eMode               /* BTALLOC_EXACT, BTALLOC_LT, or BTALLOC_ANY */
){
  MemPage *pPage1;
  int rc;
  u32 n;     /* Number of pages on the freelist */
  u32 k;     /* Number of leaves on the trunk of the freelist */
  MemPage *pTrunk = 0;
  MemPage *pPrevTrunk = 0;
  Pgno mxPage;     /* Total size of the database file */

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( eMode==BTALLOC_ANY || (nearby>0 && IfNotOmitAV(pBt->autoVacuum)) );
  pPage1 = pBt->pPage1;
  mxPage = btreePagecount(pBt);
  /* EVIDENCE-OF: R-05119-02637 The 4-byte big-endian integer at offset 36
  ** stores stores the total number of pages on the freelist. */
  n = get4byte(&pPage1->aData[36]);
  testcase( n==mxPage-1 );
  if( n>=mxPage ){
    return SQLITE_CORRUPT_BKPT;
  }
  if( n>0 ){
    /* There are pages on the freelist.  Reuse one of those pages. */
    Pgno iTrunk;
    u8 searchList = 0; /* If the free-list must be searched for 'nearby' */
    u32 nSearch = 0;   /* Count of the number of search attempts */
    
    /* If eMode==BTALLOC_EXACT and a query of the pointer-map
    ** shows that the page 'nearby' is somewhere on the free-list, then
    ** the entire-list will be searched for that page.
    */
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( eMode==BTALLOC_EXACT ){
      if( nearby<=mxPage ){
        u8 eType;
        assert( nearby>0 );
        assert( pBt->autoVacuum );
        rc = ptrmapGet(pBt, nearby, &eType, 0);
        if( rc ) return rc;
        if( eType==PTRMAP_FREEPAGE ){
          searchList = 1;
        }
      }
    }else if( eMode==BTALLOC_LE ){
      searchList = 1;
    }
#endif

    /* Decrement the free-list count by 1. Set iTrunk to the index of the
    ** first free-list trunk page. iPrevTrunk is initially 1.
    */
    rc = sqlite3PagerWrite(pPage1->pDbPage);
    if( rc ) return rc;
    put4byte(&pPage1->aData[36], n-1);

    /* The code within this loop is run only once if the 'searchList' variable
    ** is not true. Otherwise, it runs once for each trunk-page on the
    ** free-list until the page 'nearby' is located (eMode==BTALLOC_EXACT)
    ** or until a page less than 'nearby' is located (eMode==BTALLOC_LT)
    */
    do {
      pPrevTrunk = pTrunk;
      if( pPrevTrunk ){
        /* EVIDENCE-OF: R-01506-11053 The first integer on a freelist trunk page
        ** is the page number of the next freelist trunk page in the list or
        ** zero if this is the last freelist trunk page. */
        iTrunk = get4byte(&pPrevTrunk->aData[0]);
      }else{
        /* EVIDENCE-OF: R-59841-13798 The 4-byte big-endian integer at offset 32
        ** stores the page number of the first page of the freelist, or zero if
        ** the freelist is empty. */
        iTrunk = get4byte(&pPage1->aData[32]);
      }
      testcase( iTrunk==mxPage );
      if( iTrunk>mxPage || nSearch++ > n ){
        rc = SQLITE_CORRUPT_BKPT;
      }else{
        rc = btreeGetUnusedPage(pBt, iTrunk, &pTrunk, 0);
      }
      if( rc ){
        pTrunk = 0;
        goto end_allocate_page;
      }
      assert( pTrunk!=0 );
      assert( pTrunk->aData!=0 );
      /* EVIDENCE-OF: R-13523-04394 The second integer on a freelist trunk page
      ** is the number of leaf page pointers to follow. */
      k = get4byte(&pTrunk->aData[4]);
      if( k==0 && !searchList ){
        /* The trunk has no leaves and the list is not being searched. 
        ** So extract the trunk page itself and use it as the newly 
        ** allocated page */
        assert( pPrevTrunk==0 );
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        *pPgno = iTrunk;
        memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
        *ppPage = pTrunk;
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
      }else if( k>(u32)(pBt->usableSize/4 - 2) ){
        /* Value of k is out of range.  Database corruption */
        rc = SQLITE_CORRUPT_BKPT;
        goto end_allocate_page;
#ifndef SQLITE_OMIT_AUTOVACUUM
      }else if( searchList 
            && (nearby==iTrunk || (iTrunk<nearby && eMode==BTALLOC_LE)) 
      ){
        /* The list is being searched and this trunk page is the page
        ** to allocate, regardless of whether it has leaves.
        */
        *pPgno = iTrunk;
        *ppPage = pTrunk;
        searchList = 0;
        rc = sqlite3PagerWrite(pTrunk->pDbPage);
        if( rc ){
          goto end_allocate_page;
        }
        if( k==0 ){
          if( !pPrevTrunk ){
            memcpy(&pPage1->aData[32], &pTrunk->aData[0], 4);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc!=SQLITE_OK ){
              goto end_allocate_page;
            }
            memcpy(&pPrevTrunk->aData[0], &pTrunk->aData[0], 4);
          }
        }else{
          /* The trunk page is required by the caller but it contains 
          ** pointers to free-list leaves. The first leaf becomes a trunk
          ** page in this case.
          */
          MemPage *pNewTrunk;
          Pgno iNewTrunk = get4byte(&pTrunk->aData[8]);
          if( iNewTrunk>mxPage ){ 
            rc = SQLITE_CORRUPT_BKPT;
            goto end_allocate_page;
          }
          testcase( iNewTrunk==mxPage );
          rc = btreeGetUnusedPage(pBt, iNewTrunk, &pNewTrunk, 0);
          if( rc!=SQLITE_OK ){
            goto end_allocate_page;
          }
          rc = sqlite3PagerWrite(pNewTrunk->pDbPage);
          if( rc!=SQLITE_OK ){
            releasePage(pNewTrunk);
            goto end_allocate_page;
          }
          memcpy(&pNewTrunk->aData[0], &pTrunk->aData[0], 4);
          put4byte(&pNewTrunk->aData[4], k-1);
          memcpy(&pNewTrunk->aData[8], &pTrunk->aData[12], (k-1)*4);
          releasePage(pNewTrunk);
          if( !pPrevTrunk ){
            assert( sqlite3PagerIswriteable(pPage1->pDbPage) );
            put4byte(&pPage1->aData[32], iNewTrunk);
          }else{
            rc = sqlite3PagerWrite(pPrevTrunk->pDbPage);
            if( rc ){
              goto end_allocate_page;
            }
            put4byte(&pPrevTrunk->aData[0], iNewTrunk);
          }
        }
        pTrunk = 0;
        TRACE(("ALLOCATE: %d trunk - %d free pages left\n", *pPgno, n-1));
#endif
      }else if( k>0 ){
        /* Extract a leaf from the trunk */
        u32 closest;
        Pgno iPage;
        unsigned char *aData = pTrunk->aData;
        if( nearby>0 ){
          u32 i;
          closest = 0;
          if( eMode==BTALLOC_LE ){
            for(i=0; i<k; i++){
              iPage = get4byte(&aData[8+i*4]);
              if( iPage<=nearby ){
                closest = i;
                break;
              }
            }
          }else{
            int dist;
            dist = sqlite3AbsInt32(get4byte(&aData[8]) - nearby);
            for(i=1; i<k; i++){
              int d2 = sqlite3AbsInt32(get4byte(&aData[8+i*4]) - nearby);
              if( d2<dist ){
                closest = i;
                dist = d2;
              }
            }
          }
        }else{
          closest = 0;
        }

        iPage = get4byte(&aData[8+closest*4]);
        testcase( iPage==mxPage );
        if( iPage>mxPage ){
          rc = SQLITE_CORRUPT_BKPT;
          goto end_allocate_page;
        }
        testcase( iPage==mxPage );
        if( !searchList 
         || (iPage==nearby || (iPage<nearby && eMode==BTALLOC_LE)) 
        ){
          int noContent;
          *pPgno = iPage;
          TRACE(("ALLOCATE: %d was leaf %d of %d on trunk %d"
                 ": %d more free pages\n",
                 *pPgno, closest+1, k, pTrunk->pgno, n-1));
          rc = sqlite3PagerWrite(pTrunk->pDbPage);
          if( rc ) goto end_allocate_page;
          if( closest<k-1 ){
            memcpy(&aData[8+closest*4], &aData[4+k*4], 4);
          }
          put4byte(&aData[4], k-1);
          noContent = !btreeGetHasContent(pBt, *pPgno)? PAGER_GET_NOCONTENT : 0;
          rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, noContent);
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerWrite((*ppPage)->pDbPage);
            if( rc!=SQLITE_OK ){
              releasePage(*ppPage);
              *ppPage = 0;
            }
          }
          searchList = 0;
        }
      }
      releasePage(pPrevTrunk);
      pPrevTrunk = 0;
    }while( searchList );
  }else{
    /* There are no pages on the freelist, so append a new page to the
    ** database image.
    **
    ** Normally, new pages allocated by this block can be requested from the
    ** pager layer with the 'no-content' flag set. This prevents the pager
    ** from trying to read the pages content from disk. However, if the
    ** current transaction has already run one or more incremental-vacuum
    ** steps, then the page we are about to allocate may contain content
    ** that is required in the event of a rollback. In this case, do
    ** not set the no-content flag. This causes the pager to load and journal
    ** the current page content before overwriting it.
    **
    ** Note that the pager will not actually attempt to load or journal 
    ** content for any page that really does lie past the end of the database
    ** file on disk. So the effects of disabling the no-content optimization
    ** here are confined to those pages that lie between the end of the
    ** database image and the end of the database file.
    */
    int bNoContent = (0==IfNotOmitAV(pBt->bDoTruncate))? PAGER_GET_NOCONTENT:0;

    rc = sqlite3PagerWrite(pBt->pPage1->pDbPage);
    if( rc ) return rc;
    pBt->nPage++;
    if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ) pBt->nPage++;

#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum && PTRMAP_ISPAGE(pBt, pBt->nPage) ){
      /* If *pPgno refers to a pointer-map page, allocate two new pages
      ** at the end of the file instead of one. The first allocated page
      ** becomes a new pointer-map page, the second is used by the caller.
      */
      MemPage *pPg = 0;
      TRACE(("ALLOCATE: %d from end of file (pointer-map page)\n", pBt->nPage));
      assert( pBt->nPage!=PENDING_BYTE_PAGE(pBt) );
      rc = btreeGetUnusedPage(pBt, pBt->nPage, &pPg, bNoContent);
      if( rc==SQLITE_OK ){
        rc = sqlite3PagerWrite(pPg->pDbPage);
        releasePage(pPg);
      }
      if( rc ) return rc;
      pBt->nPage++;
      if( pBt->nPage==PENDING_BYTE_PAGE(pBt) ){ pBt->nPage++; }
    }
#endif
    put4byte(28 + (u8*)pBt->pPage1->aData, pBt->nPage);
    *pPgno = pBt->nPage;

    assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );
    rc = btreeGetUnusedPage(pBt, *pPgno, ppPage, bNoContent);
    if( rc ) return rc;
    rc = sqlite3PagerWrite((*ppPage)->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(*ppPage);
      *ppPage = 0;
    }
    TRACE(("ALLOCATE: %d from end of file\n", *pPgno));
  }

  assert( *pPgno!=PENDING_BYTE_PAGE(pBt) );

end_allocate_page:
  releasePage(pTrunk);
  releasePage(pPrevTrunk);
  assert( rc!=SQLITE_OK || sqlite3PagerPageRefcount((*ppPage)->pDbPage)<=1 );
  assert( rc!=SQLITE_OK || (*ppPage)->isInit==0 );
  return rc;
}